

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

int __thiscall icu_63::UnicodeString::remove(UnicodeString *this,char *__filename)

{
  UBool UVar1;
  UnicodeString *this_local;
  
  UVar1 = isBogus(this);
  if (UVar1 == '\0') {
    setZeroLength(this);
  }
  else {
    setToEmpty(this);
  }
  return (int)this;
}

Assistant:

inline UnicodeString&
UnicodeString::remove()
{
  // remove() of a bogus string makes the string empty and non-bogus
  if(isBogus()) {
    setToEmpty();
  } else {
    setZeroLength();
  }
  return *this;
}